

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Checkpoint(sqlite3 *db,int iDb,int eMode,int *pnLog,int *pnCkpt)

{
  bool bVar1;
  int local_3c;
  int local_30;
  int bBusy;
  int i;
  int rc;
  int *pnCkpt_local;
  int *pnLog_local;
  int eMode_local;
  int iDb_local;
  sqlite3 *db_local;
  
  bBusy = 0;
  bVar1 = false;
  _i = pnCkpt;
  pnCkpt_local = pnLog;
  for (local_30 = 0; local_30 < db->nDb && bBusy == 0; local_30 = local_30 + 1) {
    if ((local_30 == iDb) || (iDb == 0xc)) {
      bBusy = sqlite3BtreeCheckpoint(db->aDb[local_30].pBt,eMode,pnCkpt_local,_i);
      pnCkpt_local = (int *)0x0;
      _i = (int *)0x0;
      if (bBusy == 5) {
        bVar1 = true;
        bBusy = 0;
      }
    }
  }
  if ((bBusy == 0) && (bVar1)) {
    local_3c = 5;
  }
  else {
    local_3c = bBusy;
  }
  return local_3c;
}

Assistant:

SQLITE_PRIVATE int sqlite3Checkpoint(sqlite3 *db, int iDb, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Used to iterate through attached dbs */
  int bBusy = 0;                  /* True if SQLITE_BUSY has been encountered */

  assert( sqlite3_mutex_held(db->mutex) );
  assert( !pnLog || *pnLog==-1 );
  assert( !pnCkpt || *pnCkpt==-1 );
  testcase( iDb==SQLITE_MAX_ATTACHED ); /* See forum post a006d86f72 */
  testcase( iDb==SQLITE_MAX_DB );

  for(i=0; i<db->nDb && rc==SQLITE_OK; i++){
    if( i==iDb || iDb==SQLITE_MAX_DB ){
      rc = sqlite3BtreeCheckpoint(db->aDb[i].pBt, eMode, pnLog, pnCkpt);
      pnLog = 0;
      pnCkpt = 0;
      if( rc==SQLITE_BUSY ){
        bBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }

  return (rc==SQLITE_OK && bBusy) ? SQLITE_BUSY : rc;
}